

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::forward_relaxed_precision
          (CompilerGLSL *this,uint32_t dst_id,uint32_t *args,uint32_t length)

{
  ID local_2c;
  Precision local_28;
  uint32_t local_24;
  Precision input_precision;
  uint32_t length_local;
  uint32_t *args_local;
  CompilerGLSL *pCStack_10;
  uint32_t dst_id_local;
  CompilerGLSL *this_local;
  
  if ((((this->backend).requires_relaxed_precision_analysis & 1U) != 0) &&
     (local_24 = length, _input_precision = args, args_local._4_4_ = dst_id, pCStack_10 = this,
     local_28 = analyze_expression_precision(this,args,length), local_28 == Mediump)) {
    TypedID<(spirv_cross::Types)0>::TypedID(&local_2c,args_local._4_4_);
    Compiler::set_decoration(&this->super_Compiler,local_2c,DecorationRelaxedPrecision,0);
  }
  return;
}

Assistant:

void CompilerGLSL::forward_relaxed_precision(uint32_t dst_id, const uint32_t *args, uint32_t length)
{
	// Only GLSL supports RelaxedPrecision directly.
	// We cannot implement this in HLSL or MSL because it is tied to the type system.
	// In SPIR-V, everything must masquerade as 32-bit.
	if (!backend.requires_relaxed_precision_analysis)
		return;

	auto input_precision = analyze_expression_precision(args, length);

	// For expressions which are loaded or directly forwarded, we inherit mediump implicitly.
	// For dst_id to be analyzed properly, it must inherit any relaxed precision decoration from src_id.
	if (input_precision == Options::Mediump)
		set_decoration(dst_id, DecorationRelaxedPrecision);
}